

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::setEigenDecomposition
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  double dVar1;
  uint uVar2;
  float **ppfVar3;
  float **ppfVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  int j;
  ulong uVar12;
  
  uVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar5 = (ulong)uVar2;
  ppfVar3 = (this->super_EigenDecomposition<float,_1>).gEigenValues;
  uVar9 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
  if (((this->super_EigenDecomposition<float,_1>).kFlags & 0x100000) == 0) {
    iVar8 = 0;
    for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      ppfVar3[eigenIndex][uVar7] = (float)inEigenValues[uVar7];
      pdVar6 = inInverseEigenVectors;
      for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
        ppfVar4 = this->gCMatrices;
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          ppfVar4[eigenIndex][(long)iVar8 + uVar10] =
               (float)(inEigenVectors[uVar10] * pdVar6[uVar10]);
        }
        iVar8 = iVar8 + (int)uVar10;
        pdVar6 = pdVar6 + (int)uVar2;
      }
      inEigenVectors = inEigenVectors + (int)uVar2;
    }
  }
  else {
    iVar8 = 0;
    for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      ppfVar3[eigenIndex][uVar7] = (float)inEigenValues[uVar7];
      pdVar6 = inInverseEigenVectors;
      for (uVar12 = 0; uVar12 != uVar5; uVar12 = uVar12 + 1) {
        ppfVar4 = this->gCMatrices;
        pdVar11 = pdVar6;
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          dVar1 = *pdVar11;
          pdVar11 = pdVar11 + (int)uVar2;
          ppfVar4[eigenIndex][(long)iVar8 + uVar10] = (float)(inEigenVectors[uVar10] * dVar1);
        }
        iVar8 = iVar8 + (int)uVar10;
        pdVar6 = pdVar6 + 1;
      }
      inEigenVectors = inEigenVectors + (int)uVar2;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										           const double* inEigenVectors,
                                                   const double* inInverseEigenVectors,
                                                   const double* inEigenValues) {

    if (kFlags & BEAGLE_FLAG_INVEVEC_STANDARD) {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                            * inInverseEigenVectors[(k * kStateCount) + j];
                    l++;
                }
            }
        }
    } else {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                    * inInverseEigenVectors[k + (j*kStateCount)];
                    l++;
                }
            }
        }
    }

}